

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

quaternion dja::normalize(quaternion *q)

{
  vec4 vVar1;
  quaternion qVar2;
  vec4 local_18;
  
  local_18.x = q->re;
  local_18.y = (q->im).x;
  local_18.z = (q->im).y;
  local_18.w = (q->im).z;
  vVar1 = normalize(&local_18);
  qVar2.re = vVar1.x;
  qVar2.im.x = vVar1.y;
  qVar2.im.y = vVar1.z;
  qVar2.im.z = vVar1.w;
  return qVar2;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}